

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedicated.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_15c6f4::DedicatedState::update
          (DedicatedState *this,ALCcontext *param_1,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  pointer paVar1;
  uint uVar2;
  MixParams *mix;
  RealMixParams *pRVar3;
  float ingain;
  array<float,_16UL> coeffs;
  array<float,_16UL> local_60;
  
  pRVar3 = target.RealOut;
  mix = target.Main;
  this->mTargetGains[0xc] = 0.0;
  this->mTargetGains[0xd] = 0.0;
  this->mTargetGains[0xe] = 0.0;
  this->mTargetGains[0xf] = 0.0;
  this->mTargetGains[8] = 0.0;
  this->mTargetGains[9] = 0.0;
  this->mTargetGains[10] = 0.0;
  this->mTargetGains[0xb] = 0.0;
  this->mTargetGains[4] = 0.0;
  this->mTargetGains[5] = 0.0;
  this->mTargetGains[6] = 0.0;
  this->mTargetGains[7] = 0.0;
  this->mTargetGains[0] = 0.0;
  this->mTargetGains[1] = 0.0;
  this->mTargetGains[2] = 0.0;
  this->mTargetGains[3] = 0.0;
  ingain = slot->Gain * (props->Reverb).Density;
  if (slot->EffectType == 0x9001) {
    if (pRVar3 == (RealMixParams *)0x0) {
      uVar2 = 0xffffffff;
    }
    else {
      uVar2 = (pRVar3->ChannelIndex)._M_elems[2];
    }
    if (uVar2 == 0xffffffff) {
      CalcAmbiCoeffs(&local_60,-0.0,0.0,1.0,0.0);
      paVar1 = (mix->Buffer).mDataEnd;
      (this->super_EffectState).mOutTarget.mData = (mix->Buffer).mData;
      (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
      ComputePanGains(mix,local_60._M_elems,ingain,(span<float,_16UL>)this->mTargetGains);
      return;
    }
  }
  else {
    if (slot->EffectType != 0x9000) {
      return;
    }
    if (pRVar3 == (RealMixParams *)0x0) {
      uVar2 = 0xffffffff;
    }
    else {
      uVar2 = (pRVar3->ChannelIndex)._M_elems[3];
    }
    if (uVar2 == 0xffffffff) {
      return;
    }
  }
  paVar1 = (pRVar3->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (pRVar3->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
  this->mTargetGains[uVar2] = ingain;
  return;
}

Assistant:

void DedicatedState::update(const ALCcontext*, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    std::fill(std::begin(mTargetGains), std::end(mTargetGains), 0.0f);

    const float Gain{slot->Gain * props->Dedicated.Gain};

    if(slot->EffectType == AL_EFFECT_DEDICATED_LOW_FREQUENCY_EFFECT)
    {
        const ALuint idx{!target.RealOut ? INVALID_CHANNEL_INDEX :
            GetChannelIdxByName(*target.RealOut, LFE)};
        if(idx != INVALID_CHANNEL_INDEX)
        {
            mOutTarget = target.RealOut->Buffer;
            mTargetGains[idx] = Gain;
        }
    }
    else if(slot->EffectType == AL_EFFECT_DEDICATED_DIALOGUE)
    {
        /* Dialog goes to the front-center speaker if it exists, otherwise it
         * plays from the front-center location. */
        const ALuint idx{!target.RealOut ? INVALID_CHANNEL_INDEX :
            GetChannelIdxByName(*target.RealOut, FrontCenter)};
        if(idx != INVALID_CHANNEL_INDEX)
        {
            mOutTarget = target.RealOut->Buffer;
            mTargetGains[idx] = Gain;
        }
        else
        {
            const auto coeffs = CalcDirectionCoeffs({0.0f, 0.0f, -1.0f}, 0.0f);

            mOutTarget = target.Main->Buffer;
            ComputePanGains(target.Main, coeffs.data(), Gain, mTargetGains);
        }
    }
}